

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void __thiscall
tcu::astc::anon_unknown_0::BitAssignAccessStream::setNext
          (BitAssignAccessStream *this,int num,deUint32 bits)

{
  int iVar1;
  AssignBlock128 *this_00;
  int iVar2;
  int numBits;
  int numBits_00;
  deUint32 src;
  int iVar4;
  int iVar5;
  uint uVar3;
  
  if (num != 0) {
    iVar5 = this->m_length;
    iVar1 = this->m_ndx;
    if (iVar1 < iVar5) {
      iVar2 = num + iVar1;
      if (iVar2 <= iVar5) {
        iVar5 = iVar2;
      }
      iVar5 = iVar5 - iVar1;
      numBits_00 = 0;
      if (0 < iVar5) {
        numBits_00 = iVar5;
      }
      iVar4 = iVar1 + numBits_00 + -1;
      uVar3 = ~(-1 << ((byte)numBits_00 & 0x1f));
      if (0x1f < iVar5) {
        uVar3 = 0xffffffff;
      }
      src = uVar3 & bits;
      this->m_ndx = iVar2;
      this_00 = this->m_dst;
      iVar5 = this->m_startNdxInSrc;
      if (this->m_forward != true) {
        iVar2 = -iVar4;
        iVar4 = -iVar1;
        src = reverseBits(src,numBits_00);
        iVar1 = iVar2;
      }
      AssignBlock128::setBits(this_00,iVar1 + iVar5,iVar4 + iVar5,src);
      return;
    }
  }
  return;
}

Assistant:

void setNext (int num, deUint32 bits)
	{
		DE_ASSERT((bits & (((deUint64)1 << num) - 1)) == bits);

		if (num == 0 || m_ndx >= m_length)
			return;

		const int		end				= m_ndx + num;
		const int		numBitsToDst	= de::max(0, de::min(m_length, end) - m_ndx);
		const int		low				= m_ndx;
		const int		high			= m_ndx + numBitsToDst - 1;
		const deUint32	actualBits		= getBits(bits, 0, numBitsToDst-1);

		m_ndx += num;

		return m_forward ? m_dst.setBits(m_startNdxInSrc + low,  m_startNdxInSrc + high, actualBits)
						 : m_dst.setBits(m_startNdxInSrc - high, m_startNdxInSrc - low, reverseBits(actualBits, numBitsToDst));
	}